

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcborvalue.cpp
# Opt level: O0

QCborValue * taggedValueFromCbor(QCborStreamReader *reader,int remainingRecursionDepth)

{
  QCborError QVar1;
  Code CVar2;
  Type type_00;
  QCborStreamReader *this;
  int in_EDX;
  QCborStreamReader *in_RSI;
  QCborContainerPrivate *in_RDI;
  long in_FS_OFFSET;
  Type type;
  QCborContainerPrivate *d;
  QCborContainerPrivate *in_stack_000001c8;
  undefined8 in_stack_ffffffffffffffa8;
  QCborContainerPrivate *in_stack_ffffffffffffffb0;
  ContainerDisposition disp;
  QCborContainerPrivate *pQVar3;
  int in_stack_ffffffffffffffcc;
  QCborStreamReader *this_00;
  QCborContainerPrivate *pQVar4;
  int remainingRecursionDepth_00;
  undefined4 in_stack_fffffffffffffff0;
  QCborContainerPrivate *this_01;
  
  this_01 = *(QCborContainerPrivate **)(in_FS_OFFSET + 0x28);
  pQVar3 = in_RDI;
  if (in_EDX == 0) {
    QCborContainerPrivate::setErrorInReader
              ((QCborStreamReader *)0x46ebc5,
               (QCborError)(Code)((ulong)in_stack_ffffffffffffffa8 >> 0x20));
    QCborValue::QCborValue((QCborValue *)in_RDI,Invalid);
  }
  else {
    pQVar4 = in_RDI;
    this = (QCborStreamReader *)operator_new(0x40);
    remainingRecursionDepth_00 = (int)((ulong)pQVar4 >> 0x20);
    QCborContainerPrivate::QCborContainerPrivate(in_stack_ffffffffffffffb0);
    this_00 = this;
    QCborStreamReader::toTag(in_RSI);
    QCborContainerPrivate::append(pQVar3,(QCborTag)in_RDI);
    QCborStreamReader::next(this_00,in_stack_ffffffffffffffcc);
    QVar1 = QCborStreamReader::lastError(this);
    CVar2 = QCborError::operator_cast_to_Code((QCborError *)&stack0xfffffffffffffff4);
    if (CVar2 == NoError) {
      QCborContainerPrivate::decodeValueFromCbor
                (this_01,(QCborStreamReader *)CONCAT44(QVar1.c,in_stack_fffffffffffffff0),
                 remainingRecursionDepth_00);
    }
    QCborStreamReader::lastError(this);
    disp = (ContainerDisposition)((ulong)this >> 0x20);
    CVar2 = QCborError::operator_cast_to_Code((QCborError *)&stack0xfffffffffffffff0);
    if (CVar2 == NoError) {
      type_00 = convertToExtendedType(in_stack_000001c8);
    }
    else {
      type_00 = Invalid;
    }
    QCborContainerPrivate::makeValue(type_00,(qint64)pQVar3,in_RDI,disp);
  }
  if (*(QCborContainerPrivate **)(in_FS_OFFSET + 0x28) == this_01) {
    return (QCborValue *)pQVar3;
  }
  __stack_chk_fail();
}

Assistant:

static QCborValue taggedValueFromCbor(QCborStreamReader &reader, int remainingRecursionDepth)
{
    if (Q_UNLIKELY(remainingRecursionDepth == 0)) {
        QCborContainerPrivate::setErrorInReader(reader, { QCborError::NestingTooDeep });
        return QCborValue::Invalid;
    }

    auto d = new QCborContainerPrivate;
    d->append(reader.toTag());
    reader.next();

    if (reader.lastError() == QCborError::NoError) {
        // decode tagged value
        d->decodeValueFromCbor(reader, remainingRecursionDepth - 1);
    }

    QCborValue::Type type;
    if (reader.lastError() == QCborError::NoError) {
        // post-process to create our extended types
        type = convertToExtendedType(d);
    } else {
        // decoding error
        type = QCborValue::Invalid;
    }

    // note: may return invalid state!
    return QCborContainerPrivate::makeValue(type, -1, d);
}